

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.h
# Opt level: O2

bool operator<(ExactFloat *a,ExactFloat *b)

{
  int iVar1;
  bool bVar2;
  
  if (((a->bn_exp_ == 0x7fffffff) || (b->bn_exp_ == 0x7fffffff)) ||
     (b->bn_exp_ == 0x7ffffffd && a->bn_exp_ == 0x7ffffffd)) {
    return false;
  }
  iVar1 = a->sign_;
  if (iVar1 != b->sign_) {
    return iVar1 < b->sign_;
  }
  if (0 < iVar1) {
    bVar2 = ExactFloat::UnsignedLess(a,b);
    return bVar2;
  }
  bVar2 = ExactFloat::UnsignedLess(b,a);
  return bVar2;
}

Assistant:

inline bool ExactFloat::is_nan() const { return bn_exp_ == kExpNaN; }